

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestMemCheckHandler.cxx
# Opt level: O0

bool __thiscall
cmCTestMemCheckHandler::ProcessMemCheckOutput
          (cmCTestMemCheckHandler *this,string *str,string *log,
          vector<int,_std::allocator<int>_> *results)

{
  vector<int,_std::allocator<int>_> *results_local;
  string *log_local;
  string *str_local;
  cmCTestMemCheckHandler *this_local;
  
  switch(this->MemoryTesterStyle) {
  case 1:
    this_local._7_1_ = ProcessMemCheckValgrindOutput(this,str,log,results);
    break;
  case 2:
    this_local._7_1_ = ProcessMemCheckPurifyOutput(this,str,log,results);
    break;
  case 3:
    this_local._7_1_ = ProcessMemCheckBoundsCheckerOutput(this,str,log,results);
    break;
  case 4:
  case 5:
  case 6:
  case 7:
  case 8:
    this_local._7_1_ = ProcessMemCheckSanitizerOutput(this,str,log,results);
    break;
  default:
    std::__cxx11::string::append((char *)log);
    std::__cxx11::string::append((char *)log);
    std::__cxx11::string::operator=((string *)log,(string *)str);
    this_local._7_1_ = true;
  }
  return this_local._7_1_;
}

Assistant:

bool cmCTestMemCheckHandler::ProcessMemCheckOutput(const std::string& str,
                                                   std::string& log,
                                                   std::vector<int>& results)
{
  switch (this->MemoryTesterStyle) {
    case cmCTestMemCheckHandler::VALGRIND:
      return this->ProcessMemCheckValgrindOutput(str, log, results);
    case cmCTestMemCheckHandler::PURIFY:
      return this->ProcessMemCheckPurifyOutput(str, log, results);
    case cmCTestMemCheckHandler::ADDRESS_SANITIZER:
    case cmCTestMemCheckHandler::LEAK_SANITIZER:
    case cmCTestMemCheckHandler::THREAD_SANITIZER:
    case cmCTestMemCheckHandler::MEMORY_SANITIZER:
    case cmCTestMemCheckHandler::UB_SANITIZER:
      return this->ProcessMemCheckSanitizerOutput(str, log, results);
    case cmCTestMemCheckHandler::BOUNDS_CHECKER:
      return this->ProcessMemCheckBoundsCheckerOutput(str, log, results);
    default:
      log.append("\nMemory checking style used was: ");
      log.append("None that I know");
      log = str;
      return true;
  }
}